

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioManager.c
# Opt level: O3

void AudioManagerInit(void)

{
  VxSndInit();
  VxSndLoadSound("data/sound/ambient.mp3",&ambientAudio);
  VxSndLoadSound("data/sound/sand_spawn.mp3",&sandSpawnAudio);
  VxSndLoadSound("data/sound/water_spawn.mp3",&waterSpawnAudio);
  VxSndLoadSound("data/sound/fire_spawn.mp3",&fireSpawnAudio);
  VxSndLoadSound("data/sound/stone_spawn.mp3",&stoneSpawnAudio);
  VxSndLoadSound("data/sound/plant_spawn.mp3",&plantSpawnAudio);
  if ((ambientAudio.loaded != true) || (sandSpawnAudio.loaded == false)) {
    AudioManagerInit_cold_1();
  }
  return;
}

Assistant:

void AudioManagerInit() {
#ifdef UNIX
    clock_gettime(CLOCK_MONOTONIC, &start);
    clock_gettime(CLOCK_MONOTONIC, &finish);
#endif
    VxSndInit();
    VxSndLoadSound("data/sound/ambient.mp3", &ambientAudio);
    VxSndLoadSound("data/sound/sand_spawn.mp3", &sandSpawnAudio);
    VxSndLoadSound("data/sound/water_spawn.mp3", &waterSpawnAudio);
    VxSndLoadSound("data/sound/fire_spawn.mp3", &fireSpawnAudio);
    VxSndLoadSound("data/sound/stone_spawn.mp3", &stoneSpawnAudio);
    VxSndLoadSound("data/sound/plant_spawn.mp3", &plantSpawnAudio);
    if (!ambientAudio.loaded || !sandSpawnAudio.loaded) {
        fprintf(stderr, "Can't load music!\n");
    }
}